

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

void loop_filter_data_reset
               (LFWorkerData *lf_data,YV12_BUFFER_CONFIG *frame_buffer,AV1Common *cm,MACROBLOCKD *xd
               )

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  int i;
  macroblockd_plane *pd;
  MACROBLOCKD *xd_local;
  AV1Common *cm_local;
  YV12_BUFFER_CONFIG *frame_buffer_local;
  LFWorkerData *lf_data_local;
  
  lf_data->frame_buffer = frame_buffer;
  lf_data->cm = cm;
  lf_data->xd = xd;
  for (i = 0; i < 3; i = i + 1) {
    lVar3 = (long)i;
    lVar4 = (long)i;
    lf_data->planes[lVar3].dst.buf = xd->plane[lVar4].dst.buf;
    lf_data->planes[lVar3].dst.buf0 = xd->plane[lVar4].dst.buf0;
    iVar1 = xd->plane[lVar4].dst.height;
    lf_data->planes[lVar3].dst.width = xd->plane[lVar4].dst.width;
    lf_data->planes[lVar3].dst.height = iVar1;
    uVar2 = *(undefined4 *)&xd->plane[lVar4].dst.field_0x1c;
    lf_data->planes[lVar3].dst.stride = xd->plane[lVar4].dst.stride;
    *(undefined4 *)&lf_data->planes[lVar3].dst.field_0x1c = uVar2;
    lf_data->planes[i].subsampling_x = xd->plane[i].subsampling_x;
    lf_data->planes[i].subsampling_y = xd->plane[i].subsampling_y;
  }
  return;
}

Assistant:

static inline void loop_filter_data_reset(LFWorkerData *lf_data,
                                          YV12_BUFFER_CONFIG *frame_buffer,
                                          struct AV1Common *cm,
                                          MACROBLOCKD *xd) {
  struct macroblockd_plane *pd = xd->plane;
  lf_data->frame_buffer = frame_buffer;
  lf_data->cm = cm;
  lf_data->xd = xd;
  for (int i = 0; i < MAX_MB_PLANE; i++) {
    memcpy(&lf_data->planes[i].dst, &pd[i].dst, sizeof(lf_data->planes[i].dst));
    lf_data->planes[i].subsampling_x = pd[i].subsampling_x;
    lf_data->planes[i].subsampling_y = pd[i].subsampling_y;
  }
}